

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::part_file::export_file
          (part_file *this,function<void_(long,_libtorrent::span<char>)> *f,int64_t offset,
          int64_t size,error_code *ec)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  int iVar5;
  void *pvVar6;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  __it;
  error_code *in_R9;
  char *pcVar7;
  _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  long lVar8;
  long lVar9;
  span<char> buf;
  piece_index_t piece;
  file_handle file;
  unique_lock<std::mutex> l;
  key_type local_98;
  undefined1 local_94 [36];
  long local_70;
  unique_lock<std::mutex> local_68;
  vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
  *local_58;
  undefined8 local_50;
  long local_48;
  span<char> local_40;
  
  local_68._M_device = &this->m_mutex;
  local_68._M_owns = false;
  local_50 = f;
  ::std::unique_lock<std::mutex>::lock(&local_68);
  local_68._M_owns = true;
  if ((this->m_piece_map)._M_h._M_element_count != 0) {
    lVar8 = (long)this->m_piece_size;
    iVar5 = (int)(offset / lVar8);
    local_70 = (size + offset + lVar8 + -1) / lVar8;
    local_98.m_val = iVar5;
    open_file((part_file *)local_94,(open_mode_t)(uint)this,(error_code *)0x0);
    if ((ec->failed_ == false) && (local_98.m_val < (int)local_70)) {
      this_00 = &(this->m_piece_map)._M_h;
      lVar8 = offset - iVar5 * lVar8;
      local_58 = (vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                  *)&this->m_free_slots;
      local_94._20_8_ = 0;
      pvVar6 = (void *)0x0;
      local_94._12_8_ = this_00;
      local_94._28_8_ = ec;
      do {
        p_Var3 = ::std::
                 _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (this_00,(ulong)(long)local_98.m_val %
                                    (this->m_piece_map)._M_h._M_bucket_count,&local_98,
                            (long)local_98.m_val);
        if (p_Var3 == (__node_base_ptr)0x0) {
          p_Var4 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var4 = p_Var3->_M_nxt;
        }
        lVar9 = this->m_piece_size - lVar8;
        if (size < lVar9) {
          lVar9 = size;
        }
        iVar5 = (int)lVar9;
        if (p_Var4 == (_Hash_node_base *)0x0) {
LAB_0023de41:
          local_94._20_8_ = local_94._20_8_ + (long)iVar5;
          size = size - iVar5;
          bVar1 = true;
          lVar8 = 0;
        }
        else {
          iVar2 = *(int *)((long)&p_Var4[1]._M_nxt + 4);
          local_94._4_8_ = pvVar6;
          if (pvVar6 == (void *)0x0) {
            local_94._4_8_ = operator_new__((long)this->m_piece_size);
          }
          ::std::unique_lock<std::mutex>::unlock(&local_68);
          pvVar6 = (void *)local_94._4_8_;
          pcVar7 = (char *)(long)iVar5;
          buf.m_len = this->m_header_size + lVar8 + (long)this->m_piece_size * (long)iVar2;
          buf.m_ptr = pcVar7;
          iVar2 = pread_all((aux *)(ulong)(uint)local_94._0_4_,(handle_type)local_94._4_8_,buf,
                            local_94._28_8_,in_R9);
          bVar1 = false;
          this_00 = (_Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_94._12_8_;
          if ((iVar2 != 0) && (*(bool *)(local_94._28_8_ + 4) == false)) {
            local_40.m_ptr = (char *)pvVar6;
            local_48 = local_94._20_8_;
            local_40.m_len = (difference_type)pcVar7;
            if (*(long *)(local_50 + 0x10) == 0) {
              ::std::__throw_bad_function_call();
            }
            (**(code **)(local_50 + 0x18))((_Any_data *)local_50,&local_48,&local_40);
            ::std::unique_lock<std::mutex>::lock(&local_68);
            this_00 = (_Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_94._12_8_;
            if (this->m_piece_size == iVar5) {
              p_Var3 = ::std::
                       _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::_M_find_before_node
                                 ((_Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)local_94._12_8_,
                                  (ulong)(long)local_98.m_val %
                                  (this->m_piece_map)._M_h._M_bucket_count,&local_98,
                                  (long)local_98.m_val);
              if (p_Var3 == (__node_base_ptr)0x0) {
                __it._M_cur = (__node_type *)0x0;
              }
              else {
                __it._M_cur = (__node_type *)p_Var3->_M_nxt;
              }
              if (__it._M_cur != (__node_type *)0x0) {
                __position._M_current =
                     (this->m_free_slots).
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->m_free_slots).
                    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::
                  vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                  ::
                  _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const&>
                            (local_58,__position,
                             (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                             ((long)__it._M_cur + 0xc));
                }
                else {
                  (__position._M_current)->m_val =
                       ((strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                       ((long)__it._M_cur + 0xc))->m_val;
                  (this->m_free_slots).
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                ::std::
                _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::erase(this_00,(const_iterator)__it._M_cur);
                this->m_dirty_metadata = true;
              }
            }
            goto LAB_0023de41;
          }
        }
        if (!bVar1) break;
        local_98.m_val = local_98.m_val + 1;
      } while (local_98.m_val < (int)local_70);
    }
    else {
      pvVar6 = (void *)0x0;
    }
    file_handle::~file_handle((file_handle *)local_94);
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_68);
  return;
}

Assistant:

void part_file::export_file(std::function<void(std::int64_t, span<char>)> f
		, std::int64_t const offset, std::int64_t size, error_code& ec)
	{
		std::unique_lock<std::mutex> l(m_mutex);

		// there's nothing stored in the part_file. Nothing to do
		if (m_piece_map.empty()) return;

		piece_index_t piece(int(offset / m_piece_size));
		piece_index_t const end = piece_index_t(int(((offset + size) + m_piece_size - 1) / m_piece_size));

		std::unique_ptr<char[]> buf;

		std::int64_t piece_offset = offset - std::int64_t(static_cast<int>(piece))
			* m_piece_size;
		std::int64_t file_offset = 0;
		auto file = open_file(aux::open_mode::read_only, ec);
		if (ec) return;

		for (; piece < end; ++piece)
		{
			auto const i = m_piece_map.find(piece);
			int const block_to_copy = int(std::min(m_piece_size - piece_offset, size));
			if (i != m_piece_map.end())
			{
				slot_index_t const slot = i->second;

				if (!buf) buf.reset(new char[std::size_t(m_piece_size)]);

				// don't hold the lock during disk I/O
				l.unlock();

				span<char> v = {buf.get(), block_to_copy};
				auto bytes_read = aux::pread_all(file.fd(), v, slot_offset(slot) + piece_offset, ec);
				v = v.first(static_cast<std::ptrdiff_t>(bytes_read));
				TORRENT_ASSERT(!ec);
				if (ec || v.empty()) return;

				f(file_offset, {buf.get(), block_to_copy});

				// we're done with the disk I/O, grab the lock again to update
				// the slot map
				l.lock();

				if (block_to_copy == m_piece_size)
				{
					// since we released the lock, it's technically possible that
					// another thread removed this slot map entry, and invalidated
					// our iterator. Now that we hold the lock again, perform
					// another lookup to be sure.
					auto const j = m_piece_map.find(piece);
					if (j != m_piece_map.end())
					{
						// if the slot moved, that's really suspicious
						TORRENT_ASSERT(j->second == slot);
						m_free_slots.push_back(j->second);
						m_piece_map.erase(j);
						m_dirty_metadata = true;
					}
				}
			}
			file_offset += block_to_copy;
			piece_offset = 0;
			size -= block_to_copy;
		}
	}